

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitSIMDShuffle
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          SIMDShuffle *curr)

{
  bool bVar1;
  PrecomputingExpressionRunner *pPVar2;
  Literal *pLVar3;
  Literal local_108;
  undefined1 local_f0 [8];
  Literal right;
  undefined1 local_90 [8];
  Literal left;
  undefined1 local_68 [8];
  Flow flow;
  SIMDShuffle *curr_local;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  pPVar2 = self(this);
  visit((Flow *)local_68,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)pPVar2,
        *(Expression **)(flow.breakTo.super_IString.str._M_str + 0x10));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    left.type.id._0_4_ = 1;
  }
  else {
    pLVar3 = Flow::getSingleValue((Flow *)local_68);
    wasm::Literal::Literal((Literal *)local_90,pLVar3);
    pPVar2 = self(this);
    visit((Flow *)&right.type,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)pPVar2,
          *(Expression **)(flow.breakTo.super_IString.str._M_str + 0x18));
    Flow::operator=((Flow *)local_68,(Flow *)&right.type);
    Flow::~Flow((Flow *)&right.type);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      left.type.id._0_4_ = 1;
    }
    else {
      pLVar3 = Flow::getSingleValue((Flow *)local_68);
      wasm::Literal::Literal((Literal *)local_f0,pLVar3);
      wasm::Literal::shuffleV8x16
                (&local_108,(Literal *)local_90,(Literal *)local_f0,
                 (array<unsigned_char,_16UL> *)(flow.breakTo.super_IString.str._M_str + 0x20));
      Flow::Flow(__return_storage_ptr__,&local_108);
      wasm::Literal::~Literal(&local_108);
      left.type.id._0_4_ = 1;
      wasm::Literal::~Literal((Literal *)local_f0);
    }
    wasm::Literal::~Literal((Literal *)local_90);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDShuffle(SIMDShuffle* curr) {
    NOTE_ENTER("SIMDShuffle");
    Flow flow = self()->visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    Literal left = flow.getSingleValue();
    flow = self()->visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    Literal right = flow.getSingleValue();
    return left.shuffleV8x16(right, curr->mask);
  }